

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_object.cpp
# Opt level: O2

wstring_view __thiscall
mjs::string_object::handle_array_like_access(string_object *this,wstring_view property_name)

{
  uint32_t uVar1;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> bVar2;
  wstring_view wVar3;
  wstring_view v;
  wstring_view property_name_local;
  
  property_name_local._M_str = property_name._M_str;
  property_name_local._M_len = property_name._M_len;
  if ((this->is_v5_or_later_ == true) &&
     (uVar1 = index_value_from_string(&property_name_local), uVar1 != 0xffffffff)) {
    v = view(this);
    if ((ulong)uVar1 < v._M_len) {
      bVar2 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::substr(&v,(ulong)uVar1,1)
      ;
      wVar3._M_len = bVar2._M_len;
      wVar3._M_str = bVar2._M_str;
      return wVar3;
    }
  }
  return (wstring_view)ZEXT816(0);
}

Assistant:

std::wstring_view handle_array_like_access(const std::wstring_view property_name) const {
        if (is_v5_or_later_) {
            if (const uint32_t index = index_value_from_string(property_name); index != invalid_index_value) {
                auto v = view();
                if (index < v.length()) {
                    return v.substr(index, 1);
                }
            }
        }
        return {};
    }